

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O3

WidgetSizePolicy QStyleHelper::widgetSizePolicy(QWidget *widget,QStyleOption *opt)

{
  uint uVar1;
  bool bVar2;
  
  if (widget != (QWidget *)0x0) {
    do {
      bVar2 = QWidget::testAttribute_helper(widget,WA_MacMiniSize);
      if (bVar2) {
        return SizeMini;
      }
      bVar2 = QWidget::testAttribute_helper(widget,WA_MacSmallSize);
      if (bVar2) {
        return SizeSmall;
      }
      bVar2 = QWidget::testAttribute_helper(widget,WA_MacNormalSize);
      if (bVar2) {
        return SizeLarge;
      }
      widget = *(QWidget **)(*(long *)&widget->field_0x8 + 0x10);
    } while (widget != (QWidget *)0x0);
  }
  if (opt != (QStyleOption *)0x0) {
    uVar1 = (opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    if ((uVar1 >> 0x1b & 1) != 0) {
      return SizeMini;
    }
    if ((uVar1 >> 0x1a & 1) != 0) {
      return SizeSmall;
    }
  }
  return SizeDefault;
}

Assistant:

WidgetSizePolicy widgetSizePolicy(const QWidget *widget, const QStyleOption *opt)
{
    while (widget) {
        if (widget->testAttribute(Qt::WA_MacMiniSize)) {
            return SizeMini;
        } else if (widget->testAttribute(Qt::WA_MacSmallSize)) {
            return SizeSmall;
        } else if (widget->testAttribute(Qt::WA_MacNormalSize)) {
            return SizeLarge;
        }
        widget = widget->parentWidget();
    }

    if (opt && opt->state & QStyle::State_Mini)
        return SizeMini;
    else if (opt && opt->state & QStyle::State_Small)
        return SizeSmall;

    return SizeDefault;
}